

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMaxUp
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *param_4,bool updateOverlaps)

{
  Edge EVar1;
  Edge *pEVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint axis0;
  Handle *pHandleA;
  Handle *pHandleB;
  Handle *pHVar5;
  Handle *pHVar6;
  ushort in_DX;
  int in_ESI;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  byte in_R8B;
  Edge swap;
  Handle *handle1;
  Handle *handle0;
  int axis2;
  int axis1;
  Handle *pHandleNext;
  Handle *pHandleEdge;
  Edge *pNext;
  Edge *pEdge;
  Edge *local_30;
  Edge *local_28;
  
  local_28 = in_RDI->m_pEdges[in_ESI] + (int)(uint)in_DX;
  pHandleA = getHandle(in_RDI,local_28->m_handle);
  pEVar2 = local_28;
  while( true ) {
    local_30 = pEVar2 + 1;
    bVar3 = false;
    if (pEVar2[1].m_handle != 0) {
      bVar3 = local_30->m_pos <= local_28->m_pos;
    }
    if (!bVar3) break;
    pHandleB = getHandle(in_RDI,pEVar2[1].m_handle);
    axis0 = 1 << ((byte)in_ESI & 0x1f) & 3;
    uVar4 = Edge::IsMax(local_30);
    if (uVar4 == 0) {
      if (((in_R8B & 1) != 0) &&
         (bVar3 = testOverlap2D(in_RDI,pHandleA,pHandleB,axis0,1 << (sbyte)axis0 & 3), bVar3)) {
        pHVar5 = getHandle(in_RDI,local_28->m_handle);
        pHVar6 = getHandle(in_RDI,pEVar2[1].m_handle);
        (*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (in_RDI->m_pairCache,pHVar5,pHVar6);
        if (in_RDI->m_userPairCallback != (btOverlappingPairCallback *)0x0) {
          (*in_RDI->m_userPairCallback->_vptr_btOverlappingPairCallback[2])
                    (in_RDI->m_userPairCallback,pHVar5,pHVar6);
        }
      }
      pHandleB->m_maxEdges[(long)in_ESI + -3] = pHandleB->m_maxEdges[(long)in_ESI + -3] - 1;
    }
    else {
      pHandleB->m_maxEdges[in_ESI] = pHandleB->m_maxEdges[in_ESI] - 1;
    }
    pHandleA->m_maxEdges[in_ESI] = pHandleA->m_maxEdges[in_ESI] + 1;
    EVar1 = *local_28;
    *local_28 = *local_30;
    *local_30 = EVar1;
    local_28 = local_28 + 1;
    pEVar2 = local_30;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1  << axis) & 3;
		const int axis2 = (1  << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext,axis1,axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0,handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0,handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
	
}